

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_MapDirectory_Test::TestBody
          (DiskSourceTreeTest_MapDirectory_Test *this)

{
  pointer pbVar1;
  char *contents;
  string_view virtual_path;
  string_view disk_path;
  allocator<char> local_99;
  string local_98;
  AlphaNum local_68;
  
  pbVar1 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
  local_68.piece_ = absl::lts_20250127::NullSafeStringView("/foo");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)&stack0xffffffffffffffc8,(lts_20250127 *)&local_98,&local_68,&local_68);
  DiskSourceTreeTest::AddFile
            ((DiskSourceTreeTest *)&stack0xffffffffffffffc8,(string *)"Hello World!",contents);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  pbVar1 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  virtual_path._M_str = "baz";
  virtual_path._M_len = 3;
  disk_path._M_str = (pbVar1->_M_dataplus)._M_p;
  disk_path._M_len = pbVar1->_M_string_length;
  DiskSourceTree::MapPath(&(this->super_DiskSourceTreeTest).source_tree_,virtual_path,disk_path);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"baz/foo",(allocator<char> *)&local_68);
  DiskSourceTreeTest::ExpectFileContents(&this->super_DiskSourceTreeTest,&local_98,"Hello World!");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"baz/bar",(allocator<char> *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"File not found.",&local_99);
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"foo",(allocator<char> *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"File not found.",&local_99);
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"bar",(allocator<char> *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"File not found.",&local_99);
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"baz//foo",(allocator<char> *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,&local_99);
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"baz/../baz/foo",(allocator<char> *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,&local_99);
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"baz/./foo",(allocator<char> *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,&local_99);
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"baz/foo/",(allocator<char> *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"File not found.",&local_99);
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,&local_98,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

TEST_F(DiskSourceTreeTest, MapDirectory) {
  // Test opening a file in a directory that is mapped to somewhere other
  // than the root of the source tree.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  source_tree_.MapPath("baz", dirnames_[0]);

  ExpectFileContents("baz/foo", "Hello World!");
  ExpectCannotOpenFile("baz/bar", "File not found.");
  ExpectCannotOpenFile("foo", "File not found.");
  ExpectCannotOpenFile("bar", "File not found.");

  // Non-canonical file names should not work.
  ExpectCannotOpenFile("baz//foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/../baz/foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/./foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/foo/", "File not found.");
}